

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O3

SUNErrCode SUNQRAdd_DCGS2(N_Vector *Q,sunrealtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  uint nvec;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  sunrealtype __x;
  double dVar4;
  
  N_VScale(1.0,df,*QRdata);
  if (0 < m) {
    N_VDotProdMulti(m,*QRdata,Q,R + mMax * m);
    if (m != 1) {
      nvec = m - 1;
      uVar3 = (ulong)nvec;
      N_VDotProdMulti(nvec,Q[uVar3],Q,*(sunrealtype **)((long)QRdata + 0x10));
      N_VLinearCombination
                (nvec,*(sunrealtype **)((long)QRdata + 0x10),Q,*(N_Vector *)((long)QRdata + 8));
      N_VLinearSum(1.0,Q[uVar3],-1.0,*(N_Vector *)((long)QRdata + 8),Q[uVar3]);
      lVar1 = *(long *)((long)QRdata + 0x10);
      uVar2 = 0;
      do {
        R[(long)(int)(nvec * mMax) + uVar2] =
             R[(long)(int)(nvec * mMax) + uVar2] + *(double *)(lVar1 + uVar2 * 8);
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
    N_VLinearCombination(m,R + mMax * m,Q,*(N_Vector *)((long)QRdata + 8));
    N_VLinearSum(1.0,*QRdata,-1.0,*(N_Vector *)((long)QRdata + 8),*QRdata);
  }
  __x = N_VDotProd(*QRdata,*QRdata);
  dVar4 = 0.0;
  if (0.0 < __x) {
    if (__x < 0.0) {
      dVar4 = sqrt(__x);
    }
    else {
      dVar4 = SQRT(__x);
    }
  }
  R[(mMax + 1) * m] = dVar4;
  N_VScale(1.0 / dVar4,*QRdata,Q[m]);
  return 0;
}

Assistant:

SUNErrCode SUNQRAdd_DCGS2(N_Vector* Q, sunrealtype* R, N_Vector df, int m,
                          int mMax, void* QRdata)
{
  SUNFunctionBegin(Q[0]->sunctx);
  sunindextype j;
  SUNQRData qrdata = (SUNQRData)QRdata;

  N_VScale(ONE, df, qrdata->vtemp);
  SUNCheckLastErr(); /* temp = df */

  if (m > 0)
  {
    /* R(1:k-1,k) = Q_k-1^T df_aa */
    SUNCheckCall(N_VDotProdMulti(m, qrdata->vtemp, Q, R + m * mMax));
    /* Delayed reorthogonalization */
    if (m > 1)
    {
      /* s = Q_k-2^T Q(:,k-1) */
      SUNCheckCall(N_VDotProdMulti(m - 1, Q[m - 1], Q, qrdata->temp_array));

      /* Q(:,k-1) = Q(:,k-1) - Q_k-2 s */
      SUNCheckCall(
        N_VLinearCombination(m - 1, qrdata->temp_array, Q, qrdata->vtemp2));
      N_VLinearSum(ONE, Q[m - 1], -ONE, qrdata->vtemp2, Q[m - 1]);
      SUNCheckLastErr();

      /* R(1:k-2,k-1) = R(1:k-2,k-1) + s */
      for (j = 0; j < m - 1; j++)
      {
        R[(m - 1) * mMax + j] = R[(m - 1) * mMax + j] + qrdata->temp_array[j];
      }
    }

    /* df = df - Q(:,k-1) R(1:k-1,k) */
    SUNCheckCall(N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2));
    N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp);
    SUNCheckLastErr();
  }

  /* R(k,k) = \| df \| */
  R[m * mMax + m] = N_VDotProd(qrdata->vtemp, qrdata->vtemp);
  SUNCheckLastErr();
  R[m * mMax + m] = SUNRsqrt(R[m * mMax + m]);
  /* Q(:,k) = df / R(k,k) */
  N_VScale((1 / R[m * mMax + m]), qrdata->vtemp, Q[m]);
  SUNCheckLastErr();

  return SUN_SUCCESS;
}